

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities_impl.hpp
# Opt level: O3

string * __thiscall
websocketpp::utility::to_hex_abi_cxx11_
          (string *__return_storage_ptr__,utility *this,uint8_t *input,size_t length)

{
  uint8_t *puVar1;
  string hex;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"0123456789ABCDEF","");
  if (input != (uint8_t *)0x0) {
    puVar1 = (uint8_t *)0x0;
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      puVar1 = puVar1 + 1;
    } while (input != puVar1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_hex(uint8_t const * input, size_t length) {
    std::string output;
    std::string hex = "0123456789ABCDEF";

    for (size_t i = 0; i < length; i++) {
        output += hex[(input[i] & 0xF0) >> 4];
        output += hex[input[i] & 0x0F];
        output += " ";
    }

    return output;
}